

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>
::RU_matrix(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>
            *this,RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>
                  *matrixToCopy,Column_settings *colSettings)

{
  Column_container *this_00;
  pointer pIVar1;
  Column_settings *pCVar2;
  Field_operators *pFVar3;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>
  *cont;
  pointer __args;
  
  RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>
  ::RU_pairing((RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>
                *)this,(RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>
                        *)matrixToCopy);
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>
  ::Boundary_matrix(&this->reducedMatrixR_,&matrixToCopy->reducedMatrixR_,colSettings);
  Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>_>
  ::Base_swap(&(this->mirrorMatrixU_).
               super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_true>_>_>_>
              ,&(matrixToCopy->mirrorMatrixU_).
                super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_true>_>_>_>
             );
  this_00 = &(this->mirrorMatrixU_).matrix_;
  (this->mirrorMatrixU_).matrix_.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mirrorMatrixU_).matrix_.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mirrorMatrixU_).matrix_.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mirrorMatrixU_).nextInsertIndex_ = (matrixToCopy->mirrorMatrixU_).nextInsertIndex_;
  pCVar2 = colSettings;
  if (colSettings == (Column_settings *)0x0) {
    pCVar2 = (matrixToCopy->mirrorMatrixU_).colSettings_;
  }
  (this->mirrorMatrixU_).colSettings_ = pCVar2;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>_>_>
  ::reserve(this_00,((long)(matrixToCopy->mirrorMatrixU_).matrix_.
                           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(matrixToCopy->mirrorMatrixU_).matrix_.
                           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
  __args = (matrixToCopy->mirrorMatrixU_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (matrixToCopy->mirrorMatrixU_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__args != pIVar1) {
    do {
      std::
      vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true>>>>>
      ::
      emplace_back<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true>>>const&,Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true>>::Column_z2_settings*&>
                ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true>>>>>
                  *)this_00,__args,&(this->mirrorMatrixU_).colSettings_);
      __args = __args + 1;
    } while (__args != pIVar1);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->pivotToColumnIndex_,&matrixToCopy->pivotToColumnIndex_);
  this->nextEventIndex_ = matrixToCopy->nextEventIndex_;
  if (colSettings == (Column_settings *)0x0) {
    pFVar3 = matrixToCopy->operators_;
  }
  else {
    pFVar3 = (Field_operators *)0x0;
  }
  this->operators_ = pFVar3;
  return;
}

Assistant:

inline RU_matrix<Master_matrix>::RU_matrix(const RU_matrix& matrixToCopy, Column_settings* colSettings)
    : Pair_opt(static_cast<const Pair_opt&>(matrixToCopy)),
      Swap_opt(static_cast<const Swap_opt&>(matrixToCopy)),
      Rep_opt(static_cast<const Rep_opt&>(matrixToCopy)),
      reducedMatrixR_(matrixToCopy.reducedMatrixR_, colSettings),
      mirrorMatrixU_(matrixToCopy.mirrorMatrixU_, colSettings),
      pivotToColumnIndex_(matrixToCopy.pivotToColumnIndex_),
      nextEventIndex_(matrixToCopy.nextEventIndex_),
      operators_(colSettings == nullptr ? matrixToCopy.operators_ : nullptr)
{
  if constexpr (!Master_matrix::Option_list::is_z2) {
    if (colSettings != nullptr) operators_ = &(colSettings->operators);
  }
}